

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v_basic.c
# Opt level: O0

_Bool mptest_clear_row(int nrow,int ncol,m256v *Ml,m2v *Ms)

{
  int iVar1;
  int in_EDI;
  int r;
  int i;
  int in_stack_ffffffffffffffdc;
  int iVar2;
  
  for (iVar2 = 0; iVar2 < 7; iVar2 = iVar2 + 1) {
    iVar1 = rand();
    iVar1 = iVar1 % in_EDI;
    m256v_clear_row((m256v *)CONCAT44(iVar2,iVar1),in_stack_ffffffffffffffdc);
    m2v_clear_row((m2v *)CONCAT44(iVar2,iVar1),in_stack_ffffffffffffffdc);
  }
  return true;
}

Assistant:

static bool mptest_clear_row(int nrow, int ncol, m256v* Ml, m2v* Ms)
{
	for (int i = 0; i < 7; ++i) {
		const int r = rand() % nrow;

		m256v_clear_row(Ml, r);
		m2v_clear_row(Ms, r);
	}
	return true;
}